

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::InvalidInputException::
InvalidInputException<duckdb::MultiFileLocalColumnId,unsigned_long,unsigned_long>
          (InvalidInputException *this)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  Exception::ConstructMessage<duckdb::MultiFileLocalColumnId,unsigned_long,unsigned_long>
            ((string *)local_30);
  duckdb::InvalidInputException::InvalidInputException(this,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}